

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  int *piVar6;
  Mat *pMVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int l;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int z;
  int iVar23;
  int iVar24;
  long lVar25;
  int i;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int local_170;
  allocator_type local_169;
  Option *local_168;
  ulong local_160;
  Mat *local_158;
  float *local_150;
  long local_148;
  size_t local_140;
  ulong local_138;
  long local_130;
  Mat local_128;
  long local_d8;
  ulong local_d0;
  void *local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  void *local_a8;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  
  uVar2 = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  iVar11 = this->kernel_w;
  iVar16 = this->dilation_w;
  iVar24 = this->kernel_h;
  iVar3 = this->dilation_h;
  iVar10 = this->kernel_d;
  iVar18 = this->dilation_d;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  opt_pad.lightmode = opt->lightmode;
  opt_pad._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_pad.num_threads = opt->num_threads;
  opt_pad.blob_allocator = opt->blob_allocator;
  opt_pad.workspace_allocator = opt->workspace_allocator;
  opt_pad.openmp_blocktime = opt->openmp_blocktime;
  opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
  opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_pad.use_int8_inference = opt->use_int8_inference;
  opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
  uVar27._0_1_ = opt->use_bf16_storage;
  uVar27._1_1_ = opt->use_fp16_packed;
  uVar27._2_1_ = opt->use_fp16_storage;
  uVar27._3_1_ = opt->use_fp16_arithmetic;
  uVar27._4_1_ = opt->use_int8_packed;
  uVar27._5_1_ = opt->use_int8_storage;
  uVar27._6_1_ = opt->use_int8_arithmetic;
  uVar27._7_1_ = opt->use_packing_layout;
  opt_pad.use_shader_pack8 = opt->use_shader_pack8;
  opt_pad.use_subgroup_basic = opt->use_subgroup_basic;
  opt_pad.use_subgroup_vote = opt->use_subgroup_vote;
  opt_pad.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_pad.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_pad.use_image_storage = opt->use_image_storage;
  opt_pad.use_tensor_storage = opt->use_tensor_storage;
  opt_pad.use_reserved_0 = opt->use_reserved_0;
  opt_pad.flush_denormals = opt->flush_denormals;
  opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_pad.use_shader_local_memory = opt->use_shader_local_memory;
  opt_pad.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_pad.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_pad.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_pad.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_pad.use_reserved_6 = opt->use_reserved_6;
  opt_pad.use_reserved_7 = opt->use_reserved_7;
  opt_pad.use_reserved_8 = opt->use_reserved_8;
  opt_pad.use_reserved_9 = opt->use_reserved_9;
  opt_pad.use_reserved_10 = opt->use_reserved_10;
  opt_pad.use_reserved_11 = opt->use_reserved_11;
  opt_pad._32_8_ = uVar27 & 0xffffffffffffff;
  local_168 = opt;
  make_padding(this,bottom_blob,&local_128,&opt_pad);
  iVar8 = local_128.h;
  iVar19 = -100;
  if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
    local_148 = CONCAT44(local_148._4_4_,local_128.w);
    uVar27 = (long)(~((iVar11 + -1) * iVar16) + local_128.w) / (long)this->stride_w;
    uVar28 = (long)(~((iVar24 + -1) * iVar3) + local_128.h) / (long)this->stride_h;
    uVar17 = (long)(~((iVar10 + -1) * iVar18) + local_128.d) / (long)this->stride_d;
    uVar9 = this->kernel_w * this->kernel_h * this->kernel_d;
    local_158 = top_blob;
    local_140 = sVar4;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar9,&local_169);
    pMVar7 = local_158;
    iVar10 = (int)uVar27 + 1;
    iVar11 = this->dilation_h;
    iVar16 = this->kernel_w;
    iVar24 = this->kernel_h;
    iVar20 = this->dilation_w * iVar16;
    iVar3 = this->dilation_d;
    iVar18 = iVar11 * iVar24;
    iVar19 = 0;
    iVar21 = 0;
    for (iVar23 = 0; iVar23 < this->kernel_d; iVar23 = iVar23 + 1) {
      for (iVar26 = 0; iVar26 < iVar24; iVar26 = iVar26 + 1) {
        for (lVar25 = 0; (int)lVar25 < iVar16; lVar25 = lVar25 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar19 + lVar25] = iVar21;
          iVar21 = iVar21 + this->dilation_w;
          iVar16 = this->kernel_w;
        }
        iVar19 = iVar19 + (int)lVar25;
        iVar21 = iVar21 + (iVar11 * (int)local_148 - iVar20);
        iVar24 = this->kernel_h;
      }
      iVar21 = iVar21 + (iVar8 * iVar3 - iVar18) * (int)local_148;
    }
    local_160 = uVar27 & 0xffffffff;
    local_138 = uVar28 & 0xffffffff;
    Mat::create(local_158,iVar10,(int)uVar28 + 1,(int)uVar17 + 1,this->num_output,local_140,
                local_168->blob_allocator);
    local_c8 = pMVar7->data;
    iVar19 = -100;
    if ((local_c8 != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
      local_d8 = pMVar7->cstep * pMVar7->elemsize;
      uVar27 = 0;
      if (0 < (int)uVar9) {
        uVar27 = (ulong)uVar9;
      }
      uVar28 = 0;
      if (0 < (int)uVar2) {
        uVar28 = (ulong)uVar2;
      }
      local_b8 = (long)iVar10;
      uVar5 = this->num_output;
      if (this->num_output < 1) {
        uVar5 = 0;
      }
      local_d0 = (ulong)uVar5;
      lVar25 = (long)(int)local_160;
      local_170 = 0;
      uVar22 = local_138;
      local_130 = lVar25;
      local_c0 = uVar17 & 0xffffffff;
      for (uVar14 = 0; uVar14 != local_d0; uVar14 = uVar14 + 1) {
        local_b0 = (long)local_170 << 2;
        local_168 = (Option *)(local_d8 * uVar14 + (long)local_c8);
        local_160 = uVar14;
        for (iVar11 = 0; iVar11 <= (int)local_c0; iVar11 = iVar11 + 1) {
          local_158 = (Mat *)CONCAT44(local_158._4_4_,iVar11);
          for (iVar16 = 0; iVar16 <= (int)uVar22; iVar16 = iVar16 + 1) {
            local_140 = CONCAT44(local_140._4_4_,this->bias_term);
            iVar11 = this->activation_type;
            local_a8 = (this->bias_data).data;
            local_150 = (float *)(this->activation_params).data;
            local_148 = (long)(this->weight_data).data + local_b0;
            for (lVar15 = 0; lVar15 <= lVar25; lVar15 = lVar15 + 1) {
              if ((int)local_140 == 0) {
                fVar31 = 0.0;
              }
              else {
                fVar31 = *(float *)((long)local_a8 + local_160 * 4);
              }
              lVar12 = (long)local_128.w *
                       CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
              lVar13 = local_148;
              for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
                for (uVar22 = 0; uVar27 != uVar22; uVar22 = uVar22 + 1) {
                  fVar31 = fVar31 + *(float *)(lVar13 + uVar22 * 4) *
                                    *(float *)((long)local_128.data +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar22]
                                              * 4 + local_128.cstep *
                                                    CONCAT44(local_128.elemsize._4_4_,
                                                             (undefined4)local_128.elemsize) *
                                                    uVar17 + (long)(int)lVar15 *
                                                             (long)this->stride_w * 4 +
                                                             (long)iVar16 * (long)this->stride_h *
                                                             lVar12 + local_128.h * lVar12 *
                                                                      (long)(int)local_158 *
                                                                      (long)this->stride_d);
                }
                lVar13 = lVar13 + (long)(int)uVar9 * 4;
              }
              fVar29 = fVar31;
              switch(iVar11) {
              case 1:
                if (fVar31 <= 0.0) {
                  fVar29 = 0.0;
                }
                break;
              case 2:
                fVar29 = (float)(~-(uint)(0.0 < fVar31) & (uint)*local_150 |
                                -(uint)(0.0 < fVar31) & 0x3f800000) * fVar31;
                break;
              case 3:
                if (fVar31 <= *local_150) {
                  fVar31 = *local_150;
                }
                fVar29 = local_150[1];
                if (fVar31 <= local_150[1]) {
                  fVar29 = fVar31;
                }
                break;
              case 4:
                if (88.37626 <= fVar31) {
                  fVar31 = 88.37626;
                }
                fVar31 = expf((float)(-(uint)(fVar31 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar31 < -88.37626) & (uint)-fVar31));
                lVar25 = local_130;
                fVar29 = 1.0 / (fVar31 + 1.0);
                break;
              case 5:
                fVar29 = expf(fVar31);
                fVar29 = logf(fVar29 + 1.0);
                fVar29 = tanhf(fVar29);
                lVar25 = local_130;
                fVar29 = fVar29 * fVar31;
                break;
              case 6:
                fVar1 = *local_150;
                fVar30 = -local_150[1] / fVar1;
                fVar29 = 0.0;
                if ((fVar30 <= fVar31) && (fVar29 = fVar31, fVar31 <= fVar30 + 1.0 / fVar1)) {
                  fVar29 = (fVar1 * fVar31 + local_150[1]) * fVar31;
                }
              }
              *(float *)(&local_168->lightmode + lVar15 * 4) = fVar29;
            }
            local_168 = (Option *)(&local_168->lightmode + local_b8 * 4);
            uVar22 = local_138;
            uVar14 = local_160;
            iVar11 = (int)local_158;
          }
        }
        local_170 = local_170 + uVar2 * uVar9;
      }
      iVar19 = 0;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}